

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BG_FactorGraphCreator.cpp
# Opt level: O1

void __thiscall
BG_FactorGraphCreator::Construct_AgentBGPolicy_Variables(BG_FactorGraphCreator *this)

{
  pointer *ppVVar1;
  iterator __position;
  int iVar2;
  Index IVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  undefined4 extraout_var_01;
  uint uVar4;
  ulong uVar5;
  Var v;
  Var local_38;
  
  iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (&this->_m_vars,CONCAT44(extraout_var,iVar2));
  iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      i = Interface_ProblemToPolicyDiscretePure::GetNrPolicies
                    ((Interface_ProblemToPolicyDiscretePure *)(this->_m_bg).px,uVar4 - 1,TYPE_INDEX,
                     999999);
      IVar3 = Globals::CastLIndexToIndex(i);
      local_38._states = (size_t)IVar3;
      __position._M_current =
           (this->_m_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38._label = uVar5;
      if (__position._M_current ==
          (this->_m_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<libDAI::Var,std::allocator<libDAI::Var>>::_M_realloc_insert<libDAI::Var_const&>
                  ((vector<libDAI::Var,std::allocator<libDAI::Var>> *)&this->_m_vars,__position,
                   &local_38);
      }
      else {
        (__position._M_current)->_label = uVar5;
        (__position._M_current)->_states = local_38._states;
        ppVVar1 = &(this->_m_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      uVar5 = (ulong)uVar4;
      iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
                super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
                super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
                        ();
      uVar4 = uVar4 + 1;
    } while (uVar5 < CONCAT44(extraout_var_01,iVar2));
  }
  return;
}

Assistant:

void BG_FactorGraphCreator::Construct_AgentBGPolicy_Variables()
{   
    _m_vars.reserve( _m_bg->GetNrAgents() );

    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
    {
        libDAI::Var v(agI, CastLIndexToIndex(_m_bg->GetNrPolicies(agI)));
        _m_vars.push_back(v);
    }
}